

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_number.h
# Opt level: O1

from_chars_result_t<char> __thiscall
fast_float::from_chars_advanced<float,char>
          (fast_float *this,char *first,char *last,float *value,parse_options_t<char> options)

{
  fast_float fVar1;
  fast_float fVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [12];
  undefined1 auVar17 [16];
  from_chars_result_t<char> fVar18;
  from_chars_result_t<char> fVar19;
  from_chars_result_t<char> fVar20;
  from_chars_result_t<char> fVar21;
  int iVar22;
  int iVar23;
  size_t sVar24;
  long lVar25;
  byte bVar26;
  undefined4 uVar27;
  uint uVar28;
  ulong uVar29;
  undefined4 uVar30;
  fast_float *pfVar31;
  ulong uVar32;
  fast_float *pfVar33;
  fast_float *pfVar34;
  ulong uVar35;
  chars_format exponent_00;
  fast_float fVar36;
  ulong uVar37;
  size_t sVar38;
  long lVar39;
  uint uVar40;
  fast_float *pfVar41;
  fast_float *pfVar42;
  ulong uVar43;
  bigint *bigmant_00;
  fast_float *pfVar44;
  int32_t exponent;
  uint uVar45;
  int iVar46;
  bool bVar47;
  float fVar48;
  from_chars_result_t<char> fVar49;
  adjusted_mantissa aVar50;
  parsed_number_string_t<char> answer;
  size_t digits;
  bigint bigmant;
  parsed_number_string_t<char> local_288;
  fast_float *local_248;
  float *local_240;
  fast_float *local_238;
  size_t local_230;
  bigint local_228;
  
  if (this == (fast_float *)first) {
    fVar49._8_8_ = 0x16;
    fVar49.ptr = (char *)this;
    return fVar49;
  }
  local_288.fraction.ptr = (char *)0x0;
  local_288.fraction.length = 0;
  local_288.integer.ptr = (char *)0x0;
  local_288.integer.length = 0;
  local_288.exponent = 0;
  local_288.mantissa._0_3_ = 0;
  local_288.mantissa._3_5_ = 0;
  local_288.lastmatch._0_3_ = 0;
  local_288.lastmatch._3_5_ = 0;
  local_288.valid = false;
  local_288.too_many_digits = false;
  fVar1 = *this;
  local_288.negative = fVar1 == (fast_float)0x2d;
  fVar36 = SUB81((ulong)value >> 0x20,0);
  pfVar31 = this;
  if ((!local_288.negative) ||
     ((pfVar31 = this + 1, pfVar31 != (fast_float *)first &&
      (*pfVar31 == fVar36 || (byte)((char)*pfVar31 - 0x30U) < 10)))) {
    fVar2 = *pfVar31;
    if ((byte)((char)fVar2 - 0x30U) < 10) {
      options.format = 0;
      options.decimal_point = '\0';
      options._5_3_ = 0;
      pfVar33 = pfVar31;
      do {
        pfVar33 = pfVar33 + 1;
        options = (parse_options_t<char>)(((ulong)(byte)fVar2 + (long)options * 10) - 0x30);
        bVar47 = pfVar33 == (fast_float *)first;
        pfVar34 = (fast_float *)first;
        if (bVar47) break;
        fVar2 = *pfVar33;
        pfVar34 = pfVar33;
      } while ((byte)((char)fVar2 - 0x30U) < 10);
    }
    else {
      options.format = 0;
      options.decimal_point = '\0';
      options._5_3_ = 0;
      bVar47 = false;
      pfVar34 = pfVar31;
    }
    local_288.integer.length = (long)pfVar34 - (long)pfVar31;
    if ((bVar47) || (*pfVar34 != fVar36)) {
      pfVar44 = (fast_float *)0x0;
      sVar38 = local_288.integer.length;
      pfVar33 = pfVar34;
    }
    else {
      local_288.fraction.ptr = (char *)(pfVar34 + 1);
      lVar39 = (long)first - (long)local_288.fraction.ptr;
      pfVar44 = (fast_float *)local_288.fraction.ptr;
      while ((pfVar33 = pfVar44, 7 < lVar39 &&
             (uVar43 = *(long *)pfVar44 + 0xcfcfcfcfcfcfcfd0,
             ((*(long *)pfVar44 + 0x4646464646464646U | uVar43) & 0x8080808080808080) == 0))) {
        uVar43 = uVar43 * 10 + (uVar43 >> 8);
        options = (parse_options_t<char>)
                  (((uVar43 >> 0x10 & 0xff000000ff) * 0x271000000001 +
                    (uVar43 & 0xff000000ff) * 0xf424000000064 >> 0x20) + (long)options * 100000000);
        pfVar44 = pfVar44 + 8;
        lVar39 = lVar39 + -8;
      }
      for (; (pfVar44 != (fast_float *)first &&
             (pfVar33 = pfVar44, (byte)((char)*pfVar44 - 0x30U) < 10)); pfVar44 = pfVar44 + 1) {
        options = (parse_options_t<char>)
                  ((ulong)(byte)((char)*pfVar44 - 0x30U) + (long)options * 10);
        pfVar33 = (fast_float *)first;
      }
      pfVar44 = (fast_float *)local_288.fraction.ptr + -(long)pfVar33;
      local_288.fraction.length = (long)pfVar33 - (long)local_288.fraction.ptr;
      sVar38 = local_288.integer.length - (long)pfVar44;
      local_248 = (fast_float *)local_288.fraction.ptr;
      local_240 = value;
      local_238 = this;
    }
    local_288.integer.ptr = (char *)pfVar31;
    if (sVar38 != 0) {
      if (((ulong)value & 1) == 0) {
LAB_0040e96d:
        lVar39 = 0;
      }
      else {
        if ((pfVar33 == (fast_float *)first) || (((byte)*pfVar33 | 0x20) != 0x65)) {
          if (((ulong)value & 4) == 0) goto LAB_0040eaf7;
          goto LAB_0040e96d;
        }
        pfVar41 = pfVar33 + 1;
        if (pfVar41 == (fast_float *)first) {
LAB_0040ea7a:
          bVar47 = false;
        }
        else {
          if (*pfVar41 != (fast_float)0x2d) {
            if ((pfVar41 != (fast_float *)first) && (pfVar33[1] == (fast_float)0x2b)) {
              pfVar41 = pfVar33 + 2;
            }
            goto LAB_0040ea7a;
          }
          pfVar41 = pfVar33 + 2;
          bVar47 = true;
        }
        pfVar42 = pfVar41;
        if ((pfVar41 == (fast_float *)first) || (9 < (byte)((char)*pfVar41 - 0x30U))) {
          bVar26 = (byte)((ulong)value >> 2) & 1;
          if (((ulong)value >> 2 & 1) != 0) {
            pfVar42 = pfVar33;
          }
          lVar39 = 0;
        }
        else {
          if (pfVar41 == (fast_float *)first) {
            lVar25 = 0;
          }
          else {
            lVar25 = 0;
            do {
              pfVar42 = pfVar41;
              if (9 < (byte)((char)*pfVar41 - 0x30U)) break;
              if (lVar25 < 0x10000000) {
                lVar25 = (ulong)(byte)((char)*pfVar41 - 0x30U) + lVar25 * 10;
              }
              pfVar41 = pfVar41 + 1;
              pfVar42 = (fast_float *)first;
            } while (pfVar41 != (fast_float *)first);
          }
          lVar39 = -lVar25;
          if (!bVar47) {
            lVar39 = lVar25;
          }
          pfVar44 = pfVar44 + lVar39;
          bVar26 = 1;
        }
        pfVar33 = pfVar42;
        if (bVar26 == 0) goto LAB_0040eaf7;
      }
      local_288.lastmatch._0_3_ = SUB83(pfVar33,0);
      local_288.lastmatch._3_5_ = (undefined5)((ulong)pfVar33 >> 0x18);
      local_288.valid = true;
      pfVar33 = pfVar31;
      if (0x13 < (long)sVar38) {
        do {
          fVar2 = *pfVar33;
          if (fVar2 != fVar36 && fVar2 != (fast_float)0x30) break;
          sVar38 = sVar38 - (fVar2 == (fast_float)0x30);
          pfVar33 = pfVar33 + 1;
        } while (pfVar33 != (fast_float *)first);
        if (0x13 < (long)sVar38) {
          local_288.too_many_digits = true;
          pfVar33 = (fast_float *)local_288.fraction.ptr;
          sVar38 = local_288.fraction.length;
          if (local_288.integer.length == 0) {
            options.format = 0;
            options.decimal_point = '\0';
            options._5_3_ = 0;
          }
          else {
            options.format = 0;
            options.decimal_point = '\0';
            options._5_3_ = 0;
            sVar24 = local_288.integer.length;
            do {
              sVar24 = sVar24 - 1;
              options = (parse_options_t<char>)((long)(char)*pfVar31 + (long)options * 10 + -0x30);
              pfVar31 = pfVar31 + 1;
              if (999999999999999999 < (ulong)options) break;
            } while (sVar24 != 0);
          }
          for (; ((ulong)options < 1000000000000000000 &&
                 (pfVar31 = pfVar33, pfVar34 = (fast_float *)local_288.fraction.ptr, sVar38 != 0));
              sVar38 = sVar38 - 1) {
            options = (parse_options_t<char>)(((long)(char)*pfVar33 + (long)options * 10) - 0x30);
            pfVar31 = pfVar33 + 1;
            pfVar33 = pfVar33 + 1;
          }
          pfVar44 = pfVar34 + (lVar39 - (long)pfVar31);
        }
      }
      local_288.mantissa._0_3_ = (undefined3)options.format;
      local_288.mantissa._3_5_ = options._3_5_;
      local_288.exponent = (int64_t)pfVar44;
    }
  }
LAB_0040eaf7:
  if (local_288.valid == false) {
    fVar49 = detail::parse_infnan<float,char>((char *)this,first,(float *)last);
    return fVar49;
  }
  uVar43 = CONCAT53(local_288.lastmatch._3_5_,local_288.lastmatch._0_3_);
  if (((fast_float *)0xffffffffffffffea < (fast_float *)(local_288.exponent + -0xb)) &&
     (local_288.too_many_digits == false)) {
    if ((detail::rounds_to_nearest()::fmin + 1.0 != 1.0 - detail::rounds_to_nearest()::fmin) ||
       (NAN(detail::rounds_to_nearest()::fmin + 1.0) || NAN(1.0 - detail::rounds_to_nearest()::fmin)
       )) {
      if ((-1 < local_288.exponent) &&
         (uVar29 = CONCAT53(local_288.mantissa._3_5_,(undefined3)local_288.mantissa),
         uVar29 <= *(ulong *)(binary_format_lookup_tables<float,void>::max_mantissa +
                             local_288.exponent * 8))) {
        if (uVar29 == 0) {
          if (fVar1 == (fast_float)0x2d) {
            uVar27 = 0x80000000;
          }
          else {
            uVar27 = 0;
          }
          *(undefined4 *)last = uVar27;
          fVar21._8_8_ = 0;
          fVar21.ptr = (char *)uVar43;
          return fVar21;
        }
        fVar48 = (float)uVar29 *
                 *(float *)(binary_format_lookup_tables<float,void>::powers_of_ten +
                           local_288.exponent * 4);
        goto LAB_0040f0a2;
      }
    }
    else if (CONCAT53(local_288.mantissa._3_5_,(undefined3)local_288.mantissa) < 0x1000001) {
      fVar48 = (float)CONCAT53(local_288.mantissa._3_5_,(undefined3)local_288.mantissa);
      *(float *)last = fVar48;
      if (local_288.exponent < 0) {
        fVar48 = fVar48 / *(float *)(binary_format_lookup_tables<float,void>::powers_of_ten +
                                    local_288.exponent * -4);
      }
      else {
        fVar48 = fVar48 * *(float *)(binary_format_lookup_tables<float,void>::powers_of_ten +
                                    local_288.exponent * 4);
      }
LAB_0040f0a2:
      fVar20._8_8_ = 0;
      fVar20.ptr = (char *)uVar43;
      fVar19._8_8_ = 0;
      fVar19.ptr = (char *)uVar43;
      *(float *)last = fVar48;
      if (fVar1 != (fast_float)0x2d) {
        return fVar19;
      }
      *(float *)last = -fVar48;
      return fVar20;
    }
  }
  uVar29 = CONCAT53(local_288.mantissa._3_5_,(undefined3)local_288.mantissa);
  iVar46 = (int)local_288.exponent;
  if (local_288.exponent < -0x41 || uVar29 == 0) {
LAB_0040eba5:
    uVar40 = 0;
LAB_0040ebb6:
    bigmant_00 = (bigint *)0x0;
  }
  else {
    if (0x26 < local_288.exponent) {
      uVar40 = 0xff;
      goto LAB_0040ebb6;
    }
    uVar37 = 0x3f;
    if (uVar29 != 0) {
      for (; uVar29 >> uVar37 == 0; uVar37 = uVar37 - 1) {
      }
    }
    uVar32 = uVar29 << ((byte)(uVar37 ^ 0x3f) & 0x3f);
    auVar3._8_8_ = 0;
    auVar3._0_8_ = uVar32;
    auVar9._8_8_ = 0;
    auVar9._0_8_ = *(ulong *)(powers_template<void>::power_of_five_128 +
                             (long)(iVar46 * 2 + 0x2ac) * 8);
    auVar3 = auVar3 * auVar9;
    if ((~auVar3._8_8_ & 0x3fffffffff) == 0) {
      auVar4._8_8_ = 0;
      auVar4._0_8_ = uVar32;
      auVar10._8_8_ = 0;
      auVar10._0_8_ =
           *(ulong *)(powers_template<void>::power_of_five_128 + (long)(iVar46 * 2 + 0x2ad) * 8);
      auVar15._8_8_ = 0;
      auVar15._0_8_ = SUB168(auVar4 * auVar10,8);
      auVar3 = auVar3 + auVar15;
    }
    options = auVar3._8_8_;
    iVar22 = ((iVar46 * 0x3526a >> 0x10) - (int)(uVar37 ^ 0x3f)) - (auVar3._12_4_ >> 0x1f);
    iVar23 = iVar22 + 0xbe;
    bVar26 = auVar3[0xf] >> 7;
    uVar37 = (ulong)options >> (bVar26 | 0x26);
    if (iVar23 < 1) {
      if (iVar23 < -0x3e) goto LAB_0040eba5;
      uVar37 = (uVar37 >> ((byte)(1U - iVar23) & 0x3f)) +
               (ulong)((uVar37 >> ((ulong)(1U - iVar23) & 0x3f) & 1) != 0);
      bigmant_00 = (bigint *)(uVar37 >> 1 & 0x7fffffff);
      uVar40 = (uint)(0xffffff < uVar37);
    }
    else {
      uVar32 = (ulong)((uint)uVar37 & 0x3fffffe);
      if ((parse_options_t<char>)(uVar37 << (bVar26 | 0x26)) != options || ((uint)uVar37 & 3) != 1)
      {
        uVar32 = uVar37;
      }
      if (1 < auVar3._0_8_) {
        uVar32 = uVar37;
      }
      if ((fast_float *)0x1b < (fast_float *)(local_288.exponent + 0x11)) {
        uVar32 = uVar37;
      }
      uVar32 = ((uint)uVar32 & 1) + uVar32;
      uVar40 = (iVar22 + 0xbf) - (uint)(uVar32 < 0x2000000);
      bigmant_00 = (bigint *)(ulong)((uint)(uVar32 >> 1) & 0x37fffff);
      if (0x1ffffff < uVar32) {
        bigmant_00 = (bigint *)0x0;
      }
      if (0xfe < (int)uVar40) {
        bigmant_00 = (bigint *)0x0;
        uVar40 = 0xff;
      }
    }
  }
  if ((local_288.too_many_digits != true) || ((int)uVar40 < 0)) goto LAB_0040ed89;
  uVar37 = uVar29 + 1;
  if (local_288.exponent < -0x41 || uVar37 == 0) {
LAB_0040ebe5:
    uVar45 = 0;
LAB_0040ecf7:
    uVar28 = 0;
  }
  else {
    if (0x26 < local_288.exponent) {
      uVar45 = 0xff;
      goto LAB_0040ecf7;
    }
    uVar32 = 0x3f;
    if (uVar37 != 0) {
      for (; uVar37 >> uVar32 == 0; uVar32 = uVar32 - 1) {
      }
    }
    uVar37 = uVar37 << ((byte)(uVar32 ^ 0x3f) & 0x3f);
    auVar7._8_8_ = 0;
    auVar7._0_8_ = uVar37;
    auVar13._8_8_ = 0;
    auVar13._0_8_ =
         *(ulong *)(powers_template<void>::power_of_five_128 + (long)(iVar46 * 2 + 0x2ac) * 8);
    auVar7 = auVar7 * auVar13;
    if ((~auVar7._8_8_ & 0x3fffffffff) == 0) {
      auVar8._8_8_ = 0;
      auVar8._0_8_ = uVar37;
      auVar14._8_8_ = 0;
      auVar14._0_8_ =
           *(ulong *)(powers_template<void>::power_of_five_128 + (long)(iVar46 * 2 + 0x2ad) * 8);
      auVar17._8_8_ = 0;
      auVar17._0_8_ = SUB168(auVar8 * auVar14,8);
      auVar7 = auVar7 + auVar17;
    }
    options = auVar7._8_8_;
    iVar22 = ((iVar46 * 0x3526a >> 0x10) - (int)(uVar32 ^ 0x3f)) - (auVar7._12_4_ >> 0x1f);
    iVar23 = iVar22 + 0xbe;
    bVar26 = auVar7[0xf] >> 7;
    uVar37 = (ulong)options >> (bVar26 | 0x26);
    if (iVar23 < 1) {
      if (iVar23 < -0x3e) goto LAB_0040ebe5;
      uVar37 = (uVar37 >> ((byte)(1U - iVar23) & 0x3f)) +
               (ulong)((uVar37 >> ((ulong)(1U - iVar23) & 0x3f) & 1) != 0);
      uVar45 = (uint)(0xffffff < uVar37);
      uVar28 = (uint)(uVar37 >> 1) & 0x7fffffff;
    }
    else {
      uVar32 = (ulong)((uint)uVar37 & 0x3fffffe);
      if ((parse_options_t<char>)(uVar37 << (bVar26 | 0x26)) != options || ((uint)uVar37 & 3) != 1)
      {
        uVar32 = uVar37;
      }
      if (1 < auVar7._0_8_) {
        uVar32 = uVar37;
      }
      if ((fast_float *)0x1b < (fast_float *)(local_288.exponent + 0x11)) {
        uVar32 = uVar37;
      }
      uVar32 = ((uint)uVar32 & 1) + uVar32;
      uVar45 = (iVar22 + 0xbf) - (uint)(uVar32 < 0x2000000);
      uVar28 = (uint)(uVar32 >> 1) & 0x37fffff;
      if (0x1ffffff < uVar32) {
        uVar28 = 0;
      }
      if (0xfe < (int)uVar45) {
        uVar45 = 0xff;
        uVar28 = 0;
      }
    }
  }
  if (((uint)bigmant_00 != uVar28) || (uVar40 != uVar45)) {
    if (uVar29 == 0) {
      __assert_fail("input_num > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/external/fast_float/include/fast_float/float_common.h"
                    ,0xeb,"int fast_float::leading_zeroes(uint64_t)");
    }
    uVar37 = 0x3f;
    if (uVar29 != 0) {
      for (; uVar29 >> uVar37 == 0; uVar37 = uVar37 - 1) {
      }
    }
    uVar35 = uVar29 << ((byte)(uVar37 ^ 0x3f) & 0x3f);
    auVar5._8_8_ = 0;
    auVar5._0_8_ = uVar35;
    auVar11._8_8_ = 0;
    auVar11._0_8_ =
         *(ulong *)(powers_template<void>::power_of_five_128 + (long)(iVar46 * 2 + 0x2ac) * 8);
    uVar32 = SUB168(auVar5 * auVar11,8);
    options = SUB168(auVar5 * auVar11,0);
    if ((~uVar32 & 0x3fffffffff) == 0) {
      auVar6._8_8_ = 0;
      auVar6._0_8_ = uVar35;
      auVar12._8_8_ = 0;
      auVar12._0_8_ =
           *(ulong *)(powers_template<void>::power_of_five_128 + (long)(iVar46 * 2 + 0x2ad) * 8);
      uVar32 = uVar32 + CARRY8(SUB168(auVar6 * auVar12,8),(ulong)options);
    }
    uVar40 = (((iVar46 * 0x3526a >> 0x10) - (int)(uVar37 ^ 0x3f)) - (int)((long)uVar32 >> 0x3f)) -
             0x7f6a;
    bigmant_00 = (bigint *)(uVar32 << ((byte)(uVar32 >> 0x3f) ^ 1));
  }
LAB_0040ed89:
  exponent_00 = options.format;
  if ((int)uVar40 < 0) {
    uVar37 = uVar29;
    pfVar31 = (fast_float *)local_288.exponent;
    if (9999 < uVar29) {
      do {
        uVar29 = uVar37 / 10000;
        pfVar31 = (fast_float *)(ulong)((int)pfVar31 + 4);
        bVar47 = 99999999 < uVar37;
        uVar37 = uVar29;
      } while (bVar47);
    }
    uVar37 = uVar29;
    if (99 < uVar29) {
      do {
        uVar37 = uVar29 / 100;
        pfVar31 = (fast_float *)(ulong)((int)pfVar31 + 2);
        bVar47 = 9999 < uVar29;
        uVar29 = uVar37;
      } while (bVar47);
    }
    uVar45 = (uint)pfVar31;
    if (9 < uVar37) {
      do {
        uVar45 = (int)pfVar31 + 1;
        pfVar31 = (fast_float *)(ulong)uVar45;
        bVar47 = 99 < uVar37;
        uVar37 = uVar37 / 10;
      } while (bVar47);
    }
    local_230 = 0;
    memset(&local_228,0,0x1f8);
    parse_mantissa<char>(&local_228,&local_288,0x72,&local_230);
    iVar46 = (uVar45 - (int)local_230) + 1;
    if (iVar46 < 0) {
      aVar50.mantissa = (ulong)(uVar40 + 0x8000);
      aVar50.power2 = iVar46;
      aVar50._12_4_ = 0;
      aVar50 = negative_digit_comp<float>((fast_float *)&local_228,bigmant_00,aVar50,exponent_00);
      auVar16 = aVar50._0_12_;
    }
    else {
      aVar50 = positive_digit_comp<float>(&local_228,iVar46);
      auVar16 = aVar50._0_12_;
    }
    bigmant_00 = auVar16._0_8_;
    uVar40 = auVar16._8_4_;
  }
  uVar27 = 0;
  if (uVar40 == 0xff) {
    uVar27 = 0x22;
  }
  uVar30 = 0x22;
  if (uVar40 != 0) {
    uVar30 = uVar27;
  }
  *(uint *)last = (uint)local_288.negative << 0x1f | (uint)bigmant_00 | uVar40 << 0x17;
  if (bigmant_00 != (bigint *)0x0) {
    uVar30 = uVar27;
  }
  if (CONCAT53(local_288.mantissa._3_5_,(undefined3)local_288.mantissa) == 0) {
    uVar30 = uVar27;
  }
  fVar18.ec = uVar30;
  fVar18.ptr = (char *)uVar43;
  fVar18._12_4_ = 0;
  return fVar18;
}

Assistant:

FASTFLOAT_CONSTEXPR20
from_chars_result_t<UC> from_chars_advanced(UC const * first, UC const * last,
                                      T &value, parse_options_t<UC> options)  noexcept  {

  static_assert (std::is_same<T, double>::value || std::is_same<T, float>::value, "only float and double are supported");
  static_assert (std::is_same<UC, char>::value ||
                 std::is_same<UC, wchar_t>::value ||
                 std::is_same<UC, char16_t>::value ||
                 std::is_same<UC, char32_t>::value , "only char, wchar_t, char16_t and char32_t are supported");

  from_chars_result_t<UC> answer;
#ifdef FASTFLOAT_SKIP_WHITE_SPACE  // disabled by default
  while ((first != last) && fast_float::is_space(uint8_t(*first))) {
    first++;
  }
#endif
  if (first == last) {
    answer.ec = std::errc::invalid_argument;
    answer.ptr = first;
    return answer;
  }
  parsed_number_string_t<UC> pns = parse_number_string<UC>(first, last, options);
  if (!pns.valid) {
    return detail::parse_infnan(first, last, value);
  }

  answer.ec = std::errc(); // be optimistic
  answer.ptr = pns.lastmatch;
  // The implementation of the Clinger's fast path is convoluted because
  // we want round-to-nearest in all cases, irrespective of the rounding mode
  // selected on the thread.
  // We proceed optimistically, assuming that detail::rounds_to_nearest() returns
  // true.
  if (binary_format<T>::min_exponent_fast_path() <= pns.exponent && pns.exponent <= binary_format<T>::max_exponent_fast_path() && !pns.too_many_digits) {
    // Unfortunately, the conventional Clinger's fast path is only possible
    // when the system rounds to the nearest float.
    //
    // We expect the next branch to almost always be selected.
    // We could check it first (before the previous branch), but
    // there might be performance advantages at having the check
    // be last.
    if(!cpp20_and_in_constexpr() && detail::rounds_to_nearest())  {
      // We have that fegetround() == FE_TONEAREST.
      // Next is Clinger's fast path.
      if (pns.mantissa <=binary_format<T>::max_mantissa_fast_path()) {
        value = T(pns.mantissa);
        if (pns.exponent < 0) { value = value / binary_format<T>::exact_power_of_ten(-pns.exponent); }
        else { value = value * binary_format<T>::exact_power_of_ten(pns.exponent); }
        if (pns.negative) { value = -value; }
        return answer;
      }
    } else {
      // We do not have that fegetround() == FE_TONEAREST.
      // Next is a modified Clinger's fast path, inspired by Jakub Jelínek's proposal
      if (pns.exponent >= 0 && pns.mantissa <=binary_format<T>::max_mantissa_fast_path(pns.exponent)) {
#if defined(__clang__)
        // Clang may map 0 to -0.0 when fegetround() == FE_DOWNWARD
        if(pns.mantissa == 0) {
          value = pns.negative ? -0. : 0.;
          return answer;
        }
#endif
        value = T(pns.mantissa) * binary_format<T>::exact_power_of_ten(pns.exponent);
        if (pns.negative) { value = -value; }
        return answer;
      }
    }
  }
  adjusted_mantissa am = compute_float<binary_format<T>>(pns.exponent, pns.mantissa);
  if(pns.too_many_digits && am.power2 >= 0) {
    if(am != compute_float<binary_format<T>>(pns.exponent, pns.mantissa + 1)) {
      am = compute_error<binary_format<T>>(pns.exponent, pns.mantissa);
    }
  }
  // If we called compute_float<binary_format<T>>(pns.exponent, pns.mantissa) and we have an invalid power (am.power2 < 0),
  // then we need to go the long way around again. This is very uncommon.
  if(am.power2 < 0) { am = digit_comp<T>(pns, am); }
  to_float(pns.negative, am, value);
  // Test for over/underflow.
  if ((pns.mantissa != 0 && am.mantissa == 0 && am.power2 == 0) || am.power2 == binary_format<T>::infinite_power()) {
    answer.ec = std::errc::result_out_of_range;
  }
  return answer;
}